

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_dependency.cpp
# Opt level: O3

LogicalDependency *
duckdb::LogicalDependency::Deserialize
          (LogicalDependency *__return_storage_ptr__,Deserializer *deserializer)

{
  int iVar1;
  _Elt_pointer prVar2;
  optional_ptr<duckdb::Catalog,_true> catalog_p;
  type ret_1;
  CatalogEntryInfo entry;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  string local_e0;
  CatalogEntryInfo local_c0;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"entry");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CatalogEntryInfo::Deserialize(&local_c0,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"catalog");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_100 = &local_f0;
    local_f0._M_local_buf[0] = '\0';
    local_f8 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_100,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  prVar2 = (deserializer->data).catalogs.c.
           super__Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (prVar2 == (deserializer->data).catalogs.c.
                super__Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    catalog_p.ptr = (Catalog *)0x0;
  }
  else {
    if (prVar2 == (deserializer->data).catalogs.c.
                  super__Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      prVar2 = (deserializer->data).catalogs.c.
               super__Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    catalog_p.ptr = prVar2[-1]._M_data;
  }
  local_78[0] = local_c0.type;
  local_70._M_p = local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_c0.schema._M_dataplus._M_p,
             local_c0.schema._M_dataplus._M_p + local_c0.schema._M_string_length);
  local_50._M_p = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_c0.name._M_dataplus._M_p,
             local_c0.name._M_dataplus._M_p + local_c0.name._M_string_length);
  if (local_100 == &local_f0) {
    local_e0.field_2._8_8_ = local_f0._8_8_;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)local_100;
  }
  local_e0.field_2._M_allocated_capacity._1_7_ = local_f0._M_allocated_capacity._1_7_;
  local_e0.field_2._M_local_buf[0] = local_f0._M_local_buf[0];
  local_e0._M_string_length = local_f8;
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_100 = &local_f0;
  LogicalDependency(__return_storage_ptr__,catalog_p,(CatalogEntryInfo *)local_78,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
    operator_delete(local_c0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.schema._M_dataplus._M_p != &local_c0.schema.field_2) {
    operator_delete(local_c0.schema._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalDependency LogicalDependency::Deserialize(Deserializer &deserializer) {
	auto entry = deserializer.ReadProperty<CatalogEntryInfo>(100, "entry");
	auto catalog = deserializer.ReadPropertyWithDefault<string>(101, "catalog");
	LogicalDependency result(deserializer.TryGet<Catalog>(), entry, std::move(catalog));
	return result;
}